

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::
ContainerEqMatcher<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>
::
MatchAndExplain<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>
          (ContainerEqMatcher<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
           *this,sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                 *lhs,MatchResultListener *listener)

{
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  end;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  end_00;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  begin;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  begin_00;
  bool bVar1;
  ostream *poVar2;
  MatchResultListener *in_RDX;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *in_RSI;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *in_RDI;
  const_iterator cVar3;
  const_iterator it_1;
  bool printed_header2;
  const_iterator it;
  bool printed_header;
  ostream *os;
  StlContainerReference lhs_stl_container;
  char *in_stack_fffffffffffffee8;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
  *in_stack_fffffffffffffef0;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
  *in_stack_ffffffffffffff00;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  local_d0;
  const_iterator local_c0;
  const_iterator local_b0;
  byte local_99;
  const_iterator local_98;
  const_iterator local_88;
  const_iterator local_78;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  local_68;
  const_iterator local_58;
  const_iterator local_48;
  byte local_31;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *local_30;
  const_reference local_28;
  MatchResultListener *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  local_28 = StlContainerView<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
             ::ConstReference(in_RSI);
  bVar1 = google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
          operator==(in_stack_ffffffffffffff00,in_RDI);
  if (bVar1) {
    local_1 = true;
  }
  else {
    local_30 = (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
               MatchResultListener::stream(local_20);
    if (local_30 !=
        (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)0x0) {
      local_31 = 0;
      local_48 = google::
                 sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
                 begin((sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                        *)0x9c81cf);
      while( true ) {
        local_58 = google::
                   sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
                   end(in_stack_fffffffffffffef0);
        bVar1 = google::
                const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                ::operator!=((const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                              *)in_stack_fffffffffffffef0,
                             (const_iterator *)in_stack_fffffffffffffee8);
        if (!bVar1) break;
        local_78 = google::
                   sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
                   begin((sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                          *)0x9c8224);
        local_88 = google::
                   sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
                   end(in_stack_fffffffffffffef0);
        google::
        const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
        ::operator*((const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                     *)0x9c825b);
        begin.pos = (size_type)in_stack_ffffffffffffff00;
        begin.table = in_RDI;
        end.pos = (size_type)in_stack_fffffffffffffef0;
        end.table = (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                     *)in_stack_fffffffffffffee8;
        local_68 = ArrayAwareFind<google::const_table_iterator<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>,int>
                             (begin,end,(int *)0x9c8283);
        local_98 = google::
                   sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
                   end(in_stack_fffffffffffffef0);
        bVar1 = google::
                const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                ::operator==(&local_68,&local_98);
        if (bVar1) {
          if ((local_31 & 1) == 0) {
            std::operator<<((ostream *)local_30,"which has these unexpected elements: ");
            local_31 = 1;
          }
          else {
            std::operator<<((ostream *)local_30,", ");
          }
          google::
          const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
          ::operator*((const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                       *)0x9c8311);
          UniversalPrint<int>((int *)in_stack_fffffffffffffef0,(ostream *)in_stack_fffffffffffffee8)
          ;
        }
        google::
        const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
        ::operator++((const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                      *)in_stack_fffffffffffffef0);
      }
      local_99 = 0;
      local_b0 = google::
                 sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
                 begin((sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                        *)0x9c8344);
      while( true ) {
        local_c0 = google::
                   sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
                   end(in_stack_fffffffffffffef0);
        bVar1 = google::
                const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                ::operator!=((const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                              *)in_stack_fffffffffffffef0,
                             (const_iterator *)in_stack_fffffffffffffee8);
        if (!bVar1) break;
        google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
        begin((sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
              0x9c8387);
        google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::end
                  (in_stack_fffffffffffffef0);
        google::
        const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
        ::operator*((const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                     *)0x9c83b2);
        begin_00.pos = (size_type)in_stack_ffffffffffffff00;
        begin_00.table = in_RDI;
        end_00.pos = (size_type)in_stack_fffffffffffffef0;
        end_00.table = (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                        *)in_stack_fffffffffffffee8;
        local_d0 = ArrayAwareFind<google::const_table_iterator<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>,int>
                             (begin_00,end_00,(int *)0x9c83ce);
        cVar3 = google::
                sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::end
                          (in_stack_fffffffffffffef0);
        in_stack_ffffffffffffff00 = cVar3.table;
        bVar1 = google::
                const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                ::operator==(&local_d0,(const_iterator *)&stack0xffffffffffffff00);
        if (bVar1) {
          if ((local_99 & 1) == 0) {
            if ((local_31 & 1) == 0) {
              in_stack_fffffffffffffee8 = "which";
            }
            else {
              in_stack_fffffffffffffee8 = ",\nand";
            }
            in_stack_fffffffffffffef0 = local_30;
            poVar2 = std::operator<<((ostream *)local_30,in_stack_fffffffffffffee8);
            std::operator<<(poVar2," doesn\'t have these expected elements: ");
            local_99 = 1;
          }
          else {
            std::operator<<((ostream *)local_30,", ");
          }
          google::
          const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
          ::operator*((const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                       *)0x9c8481);
          UniversalPrint<int>((int *)in_stack_fffffffffffffef0,(ostream *)in_stack_fffffffffffffee8)
          ;
        }
        google::
        const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
        ::operator++((const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                      *)in_stack_fffffffffffffef0);
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_) return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (auto it = lhs_stl_container.begin(); it != lhs_stl_container.end();
           ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (auto it = expected_.begin(); it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(lhs_stl_container.begin(),
                                     lhs_stl_container.end(),
                                     *it) == lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }